

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcSystemFurnitureElementType::~IfcSystemFurnitureElementType
          (IfcSystemFurnitureElementType *this,void **vtt)

{
  void **vtt_local;
  IfcSystemFurnitureElementType *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSystemFurnitureElementType,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcSystemFurnitureElementType,_0UL> *)
             &(this->super_IfcFurnishingElementType).super_IfcElementType.field_0x190,vtt + 0x28);
  IfcFurnishingElementType::~IfcFurnishingElementType(&this->super_IfcFurnishingElementType,vtt + 1)
  ;
  return;
}

Assistant:

IfcSystemFurnitureElementType() : Object("IfcSystemFurnitureElementType") {}